

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

message_frame * lsvm::object::new_message_frame(block *b)

{
  uint32_t uVar1;
  int iVar2;
  message_frame *pmVar3;
  block_t *in_RDI;
  int32_t i;
  message_frame *m;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pmVar3 = (message_frame *)
           memory::allocate(CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  pmVar3->next = (message_frame_t *)0x0;
  pmVar3->b = in_RDI;
  pmVar3->op = in_RDI->op;
  set_nil((variable *)(pmVar3 + 1));
  iVar2 = in_RDI->v_copy - 1;
  while (-1 < iVar2) {
    uVar1 = in_RDI->v_args;
    (&pmVar3[1].next)[(ulong)(uVar1 + 1 + iVar2) * 2] =
         *(message_frame_t **)(&in_RDI[1].on_frame + (long)iVar2 * 0x10);
    (&pmVar3[1].next + (ulong)(uVar1 + 1 + iVar2) * 2)[1] =
         (message_frame_t *)*(bytecode_op_t **)(&in_RDI[1].on_frame + (long)iVar2 * 0x10 + 8);
  }
  return pmVar3;
}

Assistant:

message_frame* new_message_frame(block* b){
    message_frame* m = (message_frame*)lsvm::memory::allocate(
            sizeof(message_frame)+
            ((1+b->v_args+b->v_copy+b->v_temp)*sizeof(variable))
            );
    m->next = null;
    m->b = b;
    m->op = b->op;
    set_nil(&arg(0));
    // copy block enviroment variables
    int32_t i = b->v_copy-1;
    while(i >= 0){
        arg(1+b->v_args+i) = b->v[i]; 
    }    
    return m;
}